

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

int queryStrItem(void *userData,char *queryItemKey,size_t queryItemKeyLen,char *queryItemValue,
                size_t queryItemValueLen)

{
  uint uVar1;
  IResultCapture *pIVar2;
  mapped_type *this;
  undefined8 uVar3;
  allocator<char> local_333;
  allocator<char> local_332;
  allocator<char> local_331;
  string local_330;
  string local_310 [32];
  string local_2f0;
  void *local_2d0;
  AssertionInfo __assertionInfo212;
  ExpressionResultBuilder local_258;
  
  local_2d0 = userData;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"CAPTURE",&local_331);
  std::__cxx11::string::string<std::allocator<char>>
            (local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,&local_332);
  std::__cxx11::string::string((string *)&local_258,local_310);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xd4;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_333);
  Catch::AssertionInfo::AssertionInfo
            (&__assertionInfo212,&local_2f0,(SourceLineInfo *)&local_258,&local_330,
             ContinueOnFailure);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  pIVar2 = Catch::getResultCapture();
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::operator<<((ostream *)&local_258.m_stream,"queryItemKey := ");
  std::operator<<((ostream *)&local_258.m_stream,queryItemKey);
  uVar1 = (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_258,&__assertionInfo212);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar1 & 4) != 0) {
    uVar3 = __cxa_allocate_exception(1);
    __cxa_throw(uVar3,&Catch::TestFailureException::typeinfo,0);
  }
  Catch::AssertionInfo::~AssertionInfo(&__assertionInfo212);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"CAPTURE",&local_331);
  std::__cxx11::string::string<std::allocator<char>>
            (local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,&local_332);
  std::__cxx11::string::string((string *)&local_258,local_310);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xd5;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_333);
  Catch::AssertionInfo::AssertionInfo
            (&__assertionInfo212,&local_2f0,(SourceLineInfo *)&local_258,&local_330,
             ContinueOnFailure);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  pIVar2 = Catch::getResultCapture();
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::operator<<((ostream *)&local_258.m_stream,"queryItemKeyLen := ");
  std::ostream::_M_insert<unsigned_long>((ulong)&local_258.m_stream);
  uVar1 = (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_258,&__assertionInfo212);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar1 & 4) != 0) {
    uVar3 = __cxa_allocate_exception(1);
    __cxa_throw(uVar3,&Catch::TestFailureException::typeinfo,0);
  }
  Catch::AssertionInfo::~AssertionInfo(&__assertionInfo212);
  if (queryItemValue != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"CAPTURE",&local_331);
    std::__cxx11::string::string<std::allocator<char>>
              (local_310,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_332);
    std::__cxx11::string::string((string *)&local_258,local_310);
    local_258.m_data.message._M_dataplus._M_p = (pointer)0xd8;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_333);
    Catch::AssertionInfo::AssertionInfo
              (&__assertionInfo212,&local_2f0,(SourceLineInfo *)&local_258,&local_330,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    pIVar2 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
    std::operator<<((ostream *)&local_258.m_stream,"queryItemValue := ");
    std::operator<<((ostream *)&local_258.m_stream,queryItemValue);
    uVar1 = (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_258,&__assertionInfo212);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
    if ((uVar1 & 4) != 0) {
      uVar3 = __cxa_allocate_exception(1);
      __cxa_throw(uVar3,&Catch::TestFailureException::typeinfo,0);
    }
    Catch::AssertionInfo::~AssertionInfo(&__assertionInfo212);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"CAPTURE",&local_331);
    std::__cxx11::string::string<std::allocator<char>>
              (local_310,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_332);
    std::__cxx11::string::string((string *)&local_258,local_310);
    local_258.m_data.message._M_dataplus._M_p = (pointer)0xd9;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_333);
    Catch::AssertionInfo::AssertionInfo
              (&__assertionInfo212,&local_2f0,(SourceLineInfo *)&local_258,&local_330,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string(local_310);
    std::__cxx11::string::~string((string *)&local_2f0);
    pIVar2 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
    std::operator<<((ostream *)&local_258.m_stream,"queryItemValueLen := ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_258.m_stream);
    uVar1 = (*pIVar2->_vptr_IResultCapture[8])(pIVar2,&local_258,&__assertionInfo212);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
    if ((uVar1 & 4) != 0) {
      uVar3 = __cxa_allocate_exception(1);
      __cxa_throw(uVar3,&Catch::TestFailureException::typeinfo,0);
    }
    Catch::AssertionInfo::~AssertionInfo(&__assertionInfo212);
  }
  local_258.m_data.reconstructedExpression._M_dataplus._M_p =
       (pointer)&local_258.m_data.reconstructedExpression.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,queryItemValue,queryItemValue + queryItemValueLen);
  __assertionInfo212.macroName._M_dataplus._M_p = (pointer)&__assertionInfo212.macroName.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&__assertionInfo212,queryItemKey,queryItemKey + queryItemKeyLen);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)((long)local_2d0 + 0x120),&__assertionInfo212.macroName);
  std::__cxx11::string::operator=((string *)this,(string *)&local_258);
  std::__cxx11::string::~string((string *)&__assertionInfo212);
  std::__cxx11::string::~string((string *)&local_258);
  return 1;
}

Assistant:

inline int queryStrItem(void* userData, const char* queryItemKey, size_t queryItemKeyLen, const char* queryItemValue, size_t queryItemValueLen)
{
    CAPTURE(queryItemKey);
    CAPTURE(queryItemKeyLen);
    if (queryItemValue)
    {
        CAPTURE(queryItemValue);
        CAPTURE(queryItemValueLen);
    }
    static_cast<URI*>(userData)->queryStrItems[std::string(queryItemKey,queryItemKeyLen)] = std::string(queryItemValue, queryItemValueLen);
    return 1;
}